

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

int vkt::pipeline::anon_unknown_2::ImageViewTest::getArraySize(VkImageViewType viewType)

{
  undefined4 local_c;
  VkImageViewType viewType_local;
  
  if (viewType == VK_IMAGE_VIEW_TYPE_3D) {
    local_c = 1;
  }
  else if ((viewType == VK_IMAGE_VIEW_TYPE_CUBE) || (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
    local_c = 0x12;
  }
  else {
    local_c = 6;
  }
  return local_c;
}

Assistant:

int ImageViewTest::getArraySize (VkImageViewType viewType)
{
	switch (viewType)
	{
		case VK_IMAGE_VIEW_TYPE_3D:
			return 1;

		case VK_IMAGE_VIEW_TYPE_CUBE:
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			return 18;

		default:
			break;
	}

	return 6;
}